

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_set.cpp
# Opt level: O1

void __thiscall
SetFixture_InsertSingleIterator_Test::~SetFixture_InsertSingleIterator_Test
          (SetFixture_InsertSingleIterator_Test *this)

{
  (this->super_SetFixture).super_Test._vptr_Test = (_func_int **)&PTR__SetFixture_002746a8;
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~hamt_map(&(this->super_SetFixture).index_.map_);
  pstore::database::~database(&(this->super_SetFixture).db_);
  in_memory_store::~in_memory_store(&(this->super_SetFixture).store_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,400);
  return;
}

Assistant:

TEST_F (SetFixture, InsertSingleIterator) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    index_.insert (t1, "a"s);

    iterator begin = index_.begin (db_);
    iterator end = index_.end (db_);
    EXPECT_NE (begin, end);
    std::string const & v1 = (*begin);
    EXPECT_EQ ("a", v1);
    ++begin;
    EXPECT_EQ (begin, end);
}